

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonTests.cc
# Opt level: O0

void avro::json::testObject2(void)

{
  bool bVar1;
  pointer ppVar2;
  Array *this;
  const_reference pvVar3;
  String *pSVar4;
  Array *a;
  const_iterator it;
  Object *m;
  Entity n;
  char *pcVar5;
  undefined1 uVar6;
  char *in_stack_fffffffffffff9b0;
  char *in_stack_fffffffffffff9b8;
  allocator<char> *in_stack_fffffffffffff9e0;
  const_string *in_stack_fffffffffffff9e8;
  const_string *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f0;
  const_string *line_num;
  const_string *in_stack_fffffffffffff9f8;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffa00;
  basic_cstring<const_char> local_570;
  undefined1 local_560 [56];
  basic_cstring<const_char> local_528;
  assertion_result local_518;
  undefined1 local_500 [8];
  undefined1 local_4b8 [32];
  undefined1 local_498 [56];
  basic_cstring<const_char> local_460;
  assertion_result local_450;
  undefined1 local_438 [56];
  basic_cstring<const_char> local_400;
  undefined1 local_3ec [28];
  undefined1 local_3d0 [56];
  basic_cstring<const_char> local_398;
  Array *local_388;
  assertion_result local_380;
  undefined1 local_368 [56];
  basic_cstring<const_char> local_330;
  basic_cstring<const_char> local_320;
  basic_cstring<const_char> local_310;
  lazy_ostream local_300 [2];
  _Self local_2e0;
  assertion_result local_2d8;
  basic_cstring<const_char> local_2b0;
  allocator<char> local_299;
  string local_298 [32];
  _Base_ptr local_278;
  assertion_result local_270;
  basic_cstring<const_char> local_258;
  undefined1 local_248 [56];
  basic_cstring<const_char> local_210;
  assertion_result local_200;
  undefined1 local_1e8 [56];
  basic_cstring<const_char> local_1b0;
  basic_cstring<const_char> local_1a0;
  basic_cstring<const_char> local_190;
  lazy_ostream local_180 [2];
  _Self local_160;
  assertion_result local_158;
  basic_cstring<const_char> local_130;
  allocator<char> local_119;
  string local_118 [32];
  _Self local_f8;
  undefined1 local_ec [28];
  undefined1 local_d0 [56];
  basic_cstring<const_char> local_98;
  Object *local_88;
  assertion_result local_80;
  undefined1 local_68 [72];
  basic_cstring<const_char> local_20;
  Entity local_10 [16];
  
  avro::json::loadEntity((char *)local_10);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,(size_t)in_stack_fffffffffffff9f0
               ,in_stack_fffffffffffff9e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9b8,(char (*) [1])in_stack_fffffffffffff9b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&local_80.m_message,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    local_80._4_4_ = Entity::type(local_10);
    local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)0x6;
    local_80._1_3_ = 0;
    in_stack_fffffffffffff9b8 = "etObject";
    in_stack_fffffffffffff9b0 = (char *)&local_80;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::json::EntityType,avro::json::EntityType>
              (local_68,&local_80.m_message,0x9e,1,2,&local_80.field_0x4,"n.type()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x21f8c0);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_88 = Entity::objectValue_abi_cxx11_((Entity *)in_stack_fffffffffffff9b0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,(size_t)in_stack_fffffffffffff9f0
               ,in_stack_fffffffffffff9e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9b8,(char (*) [1])in_stack_fffffffffffff9b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_ec + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    local_ec._4_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
         ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                 *)0x21f997);
    local_ec._0_4_ = 2;
    in_stack_fffffffffffff9b8 = "2";
    in_stack_fffffffffffff9b0 = local_ec;
    pcVar5 = "m.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_d0,local_ec + 0xc,0xa0,1,2,local_ec + 4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x21fa0a);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  local_f8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
               *)pcVar5,(key_type *)0x21fa6f);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,(size_t)in_stack_fffffffffffff9f0
               ,in_stack_fffffffffffff9e8);
    local_160._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                *)pcVar5);
    uVar6 = (undefined1)((ulong)pcVar5 >> 0x38);
    std::operator!=(&local_f8,&local_160);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff9b0,(bool)uVar6);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_190,"it != m.end()",0xd);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9b8,
               (basic_cstring<const_char> *)in_stack_fffffffffffff9b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    pcVar5 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_158,local_180,&local_1a0,0xa3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x21fbe5);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x21fbf2);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,(size_t)in_stack_fffffffffffff9f0
               ,in_stack_fffffffffffff9e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9b8,(char (*) [1])in_stack_fffffffffffff9b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&local_200.m_message,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
                           *)in_stack_fffffffffffff9b0);
    local_200._4_4_ = Entity::type(&ppVar2->second);
    local_200.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)0x2;
    local_200._1_3_ = 0;
    in_stack_fffffffffffff9b8 = "etLong";
    in_stack_fffffffffffff9b0 = (char *)&local_200;
    pcVar5 = "it->second.type()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::json::EntityType,avro::json::EntityType>
              (local_1e8,&local_200.m_message,0xa4,1,2,&local_200.field_0x4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x21fd22);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_210,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,(size_t)in_stack_fffffffffffff9f0
               ,in_stack_fffffffffffff9e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9b8,(char (*) [1])in_stack_fffffffffffff9b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_258,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    local_270.m_message.px =
         (element_type *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                  *)pcVar5);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
                  *)in_stack_fffffffffffff9b0);
    local_270.m_message.pn.pi_ =
         (sp_counted_base *)Entity::longValue((Entity *)in_stack_fffffffffffff9b0);
    local_270.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)0x64;
    local_270._1_7_ = 0;
    in_stack_fffffffffffff9b8 = "100ll";
    in_stack_fffffffffffff9b0 = (char *)&local_270;
    pcVar5 = "m.begin()->second.longValue()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_248,&local_258,0xa5,1,2,&local_270.m_message.pn);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x21fe7b);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  local_278 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
              ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                      *)pcVar5,(key_type *)0x21fee0);
  local_f8._M_node = local_278;
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator(&local_299);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,(size_t)in_stack_fffffffffffff9f0
               ,in_stack_fffffffffffff9e8);
    local_2e0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                *)pcVar5);
    uVar6 = (undefined1)((ulong)pcVar5 >> 0x38);
    std::operator!=(&local_f8,&local_2e0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff9b0,(bool)uVar6);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_310,"it != m.end()",0xd);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9b8,
               (basic_cstring<const_char> *)in_stack_fffffffffffff9b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_320,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    pcVar5 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_2d8,local_300,&local_320,0xa8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x220054);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x220061);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_330,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,(size_t)in_stack_fffffffffffff9f0
               ,in_stack_fffffffffffff9e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9b8,(char (*) [1])in_stack_fffffffffffff9b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&local_380.m_message,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
                           *)in_stack_fffffffffffff9b0);
    local_380._4_4_ = Entity::type(&ppVar2->second);
    local_380.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)0x5;
    local_380._1_3_ = 0;
    in_stack_fffffffffffff9b8 = "etArray";
    in_stack_fffffffffffff9b0 = (char *)&local_380;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::json::EntityType,avro::json::EntityType>
              (local_368,&local_380.m_message,0xa9,1,2,&local_380.field_0x4,"it->second.type()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22018b);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
  ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
                *)in_stack_fffffffffffff9b0);
  this = Entity::arrayValue((Entity *)in_stack_fffffffffffff9b0);
  local_388 = this;
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_398,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,file,(size_t)in_stack_fffffffffffff9f0,
               in_stack_fffffffffffff9e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9b8,(char (*) [1])in_stack_fffffffffffff9b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_3ec + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    local_3ec._4_8_ =
         std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>::size(local_388);
    local_3ec._0_4_ = 2;
    in_stack_fffffffffffff9b8 = "2";
    in_stack_fffffffffffff9b0 = local_3ec;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_3d0,local_3ec + 0xc,0xab,1,2,local_3ec + 4,"a.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2202d5);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_400,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,file,(size_t)line_num,in_stack_fffffffffffff9e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9b8,(char (*) [1])in_stack_fffffffffffff9b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&local_450.m_message,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    pvVar3 = std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>::operator[]
                       (local_388,0);
    local_450._4_4_ = Entity::type(pvVar3);
    local_450.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)0x2;
    local_450._1_3_ = 0;
    in_stack_fffffffffffff9b8 = "etLong";
    in_stack_fffffffffffff9b0 = (char *)&local_450;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::json::EntityType,avro::json::EntityType>
              (local_438,&local_450.m_message,0xac,1,2,&local_450.field_0x4,"a[0].type()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2203ff);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_460,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9b8,(char (*) [1])in_stack_fffffffffffff9b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_4b8 + 0x10),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>::operator[](local_388,0);
    local_4b8._8_8_ = Entity::longValue((Entity *)in_stack_fffffffffffff9b0);
    local_4b8._0_8_ = 400;
    in_stack_fffffffffffff9b8 = "400ll";
    in_stack_fffffffffffff9b0 = local_4b8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_498,local_4b8 + 0x10,0xad,1,2,local_4b8 + 8,"a[0].longValue()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x220537);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&stack0xfffffffffffffb38,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9b8,(char (*) [1])in_stack_fffffffffffff9b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&local_518.m_message,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    pvVar3 = std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>::operator[]
                       (local_388,1);
    local_518._4_4_ = Entity::type(pvVar3);
    local_518.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)0x4;
    local_518._1_3_ = 0;
    in_stack_fffffffffffff9b8 = "etString";
    in_stack_fffffffffffff9b0 = (char *)&local_518;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::json::EntityType,avro::json::EntityType>
              (local_500,&local_518.m_message,0xae,1,2,&local_518.field_0x4,"a[1].type()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x220662);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_528,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9b8,(char (*) [1])in_stack_fffffffffffff9b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_570,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>::operator[](local_388,1);
    pSVar4 = Entity::stringValue_abi_cxx11_((Entity *)in_stack_fffffffffffff9b0);
    in_stack_fffffffffffff9b8 = "\"v0\"";
    in_stack_fffffffffffff9b0 = "v0";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
              (local_560,&local_570,0xaf,1,2,pSVar4,"a[1].stringValue()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x22077e);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  Entity::~Entity((Entity *)0x220798);
  return;
}

Assistant:

static void testObject2()
{
    Entity n = loadEntity("{\"k1\": 100, \"k2\": [400, \"v0\"]}");
    BOOST_CHECK_EQUAL(n.type(), etObject);
    const Object& m = n.objectValue();
    BOOST_CHECK_EQUAL(m.size(), 2);

    Object::const_iterator it = m.find("k1");
    BOOST_CHECK(it != m.end());
    BOOST_CHECK_EQUAL(it->second.type(), etLong);
    BOOST_CHECK_EQUAL(m.begin()->second.longValue(), 100ll);

    it = m.find("k2");
    BOOST_CHECK(it != m.end());
    BOOST_CHECK_EQUAL(it->second.type(), etArray);
    const Array& a = it->second.arrayValue();
    BOOST_CHECK_EQUAL(a.size(), 2);
    BOOST_CHECK_EQUAL(a[0].type(), etLong);
    BOOST_CHECK_EQUAL(a[0].longValue(), 400ll);
    BOOST_CHECK_EQUAL(a[1].type(), etString);
    BOOST_CHECK_EQUAL(a[1].stringValue(), "v0");
}